

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

long * __thiscall gguf_kv::get_val<long>(gguf_kv *this,size_t i)

{
  size_t sVar1;
  size_type sVar2;
  char *pcVar3;
  long in_RSI;
  long in_RDI;
  size_t type_size;
  
  if (*(int *)(in_RDI + 0x24) != 0xb) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
               ,0xb7,"GGML_ASSERT(%s) failed","type_to_gguf_type<T>::value == type");
  }
  sVar1 = gguf_type_size((gguf_type)((ulong)in_RSI >> 0x20));
  sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                    ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x28));
  if (sVar2 % sVar1 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
               ,0xbd,"GGML_ASSERT(%s) failed","data.size() % type_size == 0");
  }
  sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                    ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x28));
  if (sVar2 < (in_RSI + 1) * sVar1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
               ,0xbe,"GGML_ASSERT(%s) failed","data.size() >= (i+1)*type_size");
  }
  pcVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                     ((vector<signed_char,_std::allocator<signed_char>_> *)0x195234);
  return (long *)(pcVar3 + in_RSI * 8);
}

Assistant:

const T & get_val(const size_t i = 0) const {
        GGML_ASSERT(type_to_gguf_type<T>::value == type);
        if constexpr (std::is_same<T, std::string>::value) {
            GGML_ASSERT(data_string.size() >= i+1);
            return data_string[i];
        }
        const size_t type_size = gguf_type_size(type);
        GGML_ASSERT(data.size() % type_size == 0);
        GGML_ASSERT(data.size() >= (i+1)*type_size);
        return reinterpret_cast<const T *>(data.data())[i];
    }